

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void * duckdb_je_arena_ralloc
                 (tsdn_t *tsdn,arena_t *arena,void *ptr,size_t oldsize,size_t size,size_t alignment,
                 _Bool zero,_Bool slab,tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  cache_bin_stats_t *pcVar1;
  uint16_t uVar2;
  void **ppvVar3;
  void **ppvVar4;
  long lVar5;
  _Bool _Var6;
  uint uVar7;
  ulong uVar8;
  void *pvVar9;
  arena_t *arena_00;
  size_t sVar10;
  ulong uVar11;
  void *key;
  size_t size_00;
  cache_bin_t *pcVar12;
  rtree_t *rtree;
  arena_t *local_1f0;
  rtree_contents_t local_1c8;
  size_t newsize;
  
  if (alignment == 0) {
    if (size < 0x1001) {
      size_00 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) {
        return (void *)0x0;
      }
      uVar8 = size * 2 - 1;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      uVar8 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
      size_00 = ~uVar8 + size & uVar8;
    }
  }
  else {
    if (alignment < 0x1001 && size < 0x3801) {
      uVar8 = -alignment & (size + alignment) - 1;
      if (uVar8 < 0x1001) {
        size_00 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar8 + 7 >> 3]];
      }
      else {
        uVar11 = uVar8 * 2 - 1;
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        uVar11 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
        size_00 = ~uVar11 + uVar8 & uVar11;
      }
      uVar8 = 0x4000;
      if (size_00 < 0x4000) goto LAB_01f877c1;
    }
    else {
      if (0x7000000000000000 < alignment) {
        return (void *)0x0;
      }
      uVar8 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar8 = size * 2 - 1;
          lVar5 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          uVar8 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
          uVar8 = ~uVar8 + size & uVar8;
        }
        else {
          uVar8 = 0;
        }
        if (uVar8 < size) {
          return (void *)0x0;
        }
      }
    }
    size_00 = 0;
    if (uVar8 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar8) -
                 0x1000) {
      size_00 = uVar8;
    }
  }
LAB_01f877c1:
  if (0x7000000000000000 < size) {
    return (void *)0x0;
  }
  if (size_00 == 0) {
    return (void *)0x0;
  }
  if ((slab) &&
     (_Var6 = duckdb_je_arena_ralloc_no_move(tsdn,ptr,oldsize,size_00,0,zero,&newsize), !_Var6)) {
    duckdb_je_hook_invoke_expand
              (hook_args->is_realloc ^ hook_expand_rallocx,ptr,oldsize,size_00,(uintptr_t)ptr,
               hook_args->args);
    return ptr;
  }
  if ((0x3fff < oldsize) && (0x3fff < size_00)) {
    pvVar9 = duckdb_je_large_ralloc(tsdn,arena,ptr,size_00,alignment,zero,tcache,hook_args);
    return pvVar9;
  }
  if (alignment == 0) {
    if (size_00 < 0x1001) {
      uVar7 = (uint)duckdb_je_sz_size2index_tab[size_00 + 7 >> 3];
    }
    else {
      uVar7 = sz_size2index_compute(size_00);
    }
    local_1f0 = arena;
    if (tcache == (tcache_t *)0x0) {
LAB_01f87d4e:
      pvVar9 = duckdb_je_arena_malloc_hard(tsdn,local_1f0,size_00,uVar7,zero,slab);
    }
    else if (slab) {
      pcVar12 = tcache->bins + uVar7;
      ppvVar3 = pcVar12->stack_head;
      pvVar9 = *ppvVar3;
      ppvVar4 = ppvVar3 + 1;
      uVar2 = tcache->bins[uVar7].low_bits_low_water;
      if (uVar2 == (uint16_t)ppvVar3) {
        if (tcache->bins[uVar7].low_bits_empty == uVar2) {
          local_1f0 = arena_choose(&tsdn->tsd,arena);
          if (local_1f0 == (arena_t *)0x0) {
            pvVar9 = (void *)0x0;
            goto LAB_01f87a49;
          }
          if (pcVar12->stack_head == (void **)&duckdb_je_disabled_bin) {
            slab = true;
            goto LAB_01f87d4e;
          }
          duckdb_je_tcache_bin_flush_stashed(&tsdn->tsd,tcache,pcVar12,uVar7,true);
          pvVar9 = duckdb_je_tcache_alloc_small_hard
                             (tsdn,local_1f0,tcache,pcVar12,uVar7,(_Bool *)&newsize);
          if ((char)newsize == '\0') {
            return (void *)0x0;
          }
        }
        else {
          pcVar12->stack_head = ppvVar4;
          tcache->bins[uVar7].low_bits_low_water = (uint16_t)ppvVar4;
        }
      }
      else {
        pcVar12->stack_head = ppvVar4;
      }
      if (zero) {
        switchD_016d8eb1::default(pvVar9,0,duckdb_je_sz_index2size_tab[uVar7]);
      }
      pcVar1 = &tcache->bins[uVar7].tstats;
      pcVar1->nrequests = pcVar1->nrequests + 1;
    }
    else {
      if ((tcache->tcache_slow->tcache_nbins <= uVar7) ||
         (ppvVar4 = tcache->bins[uVar7].stack_head, ppvVar4 == (void **)&duckdb_je_disabled_bin))
      goto LAB_01f87d4e;
      pcVar12 = tcache->bins + uVar7;
      pvVar9 = *ppvVar4;
      ppvVar3 = ppvVar4 + 1;
      uVar2 = tcache->bins[uVar7].low_bits_low_water;
      if (uVar2 == (uint16_t)ppvVar4) {
        if (tcache->bins[uVar7].low_bits_empty == uVar2) {
          arena_00 = arena_choose(&tsdn->tsd,arena);
          if (arena_00 == (arena_t *)0x0) {
            return (void *)0x0;
          }
          duckdb_je_tcache_bin_flush_stashed(&tsdn->tsd,tcache,pcVar12,uVar7,false);
          if (size_00 < 0x1001) {
            sVar10 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size_00 + 7 >> 3]];
          }
          else if (size_00 < 0x7000000000000001) {
            uVar8 = size_00 * 2 - 1;
            lVar5 = 0x3f;
            if (uVar8 != 0) {
              for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
              }
            }
            uVar8 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
            sVar10 = ~uVar8 + size_00 & uVar8;
          }
          else {
            sVar10 = 0;
          }
          pvVar9 = duckdb_je_large_malloc(tsdn,arena_00,sVar10,zero);
          goto LAB_01f87a49;
        }
        pcVar12->stack_head = ppvVar3;
        tcache->bins[uVar7].low_bits_low_water = (uint16_t)ppvVar3;
      }
      else {
        pcVar12->stack_head = ppvVar3;
      }
      if (zero) {
        switchD_016d8eb1::default(pvVar9,0,duckdb_je_sz_index2size_tab[uVar7]);
      }
      pcVar1 = &tcache->bins[uVar7].tstats;
      pcVar1->nrequests = pcVar1->nrequests + 1;
    }
  }
  else {
    if ((alignment < 0x1001) && (size_00 < 0x3801)) {
      uVar8 = -alignment & (size_00 + alignment) - 1;
      if (uVar8 < 0x1001) {
        sVar10 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar8 + 7 >> 3]];
      }
      else {
        uVar11 = uVar8 * 2 - 1;
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        uVar11 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
        sVar10 = ~uVar11 + uVar8 & uVar11;
      }
      uVar8 = 0x4000;
      if (0x3fff < sVar10) goto LAB_01f879de;
    }
    else {
      uVar8 = 0x4000;
      if (0x4000 < size_00) {
        if (size_00 < 0x7000000000000001) {
          uVar8 = size_00 * 2 - 1;
          lVar5 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          uVar8 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
          uVar8 = ~uVar8 + size_00 & uVar8;
        }
        else {
          uVar8 = 0;
        }
        if (uVar8 < size_00) {
          return (void *)0x0;
        }
      }
LAB_01f879de:
      sVar10 = 0;
      if (uVar8 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar8) -
                   0x1000) {
        sVar10 = uVar8;
      }
    }
    if (sVar10 + 0x8fffffffffffffff < 0x9000000000000000) {
      return (void *)0x0;
    }
    pvVar9 = duckdb_je_arena_palloc(tsdn,arena,sVar10,alignment,zero,slab,tcache);
  }
LAB_01f87a49:
  if (pvVar9 == (void *)0x0) {
    return (void *)0x0;
  }
  key = pvVar9;
  duckdb_je_hook_invoke_alloc
            (hook_args->is_realloc ^ hook_alloc_rallocx,pvVar9,(uintptr_t)pvVar9,hook_args->args);
  duckdb_je_hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (oldsize <= size_00) {
    size_00 = oldsize;
  }
  switchD_016b45db::default(pvVar9,ptr,size_00);
  if (tcache == (tcache_t *)0x0) {
    if (oldsize < 0x1001) {
      uVar7 = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      uVar7 = sz_size2index_compute(oldsize);
    }
    if (uVar7 < 0x24) goto LAB_01f87ba8;
  }
  else {
    if (oldsize < 0x1001) {
      uVar7 = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      uVar7 = sz_size2index_compute(oldsize);
    }
    if (uVar7 < 0x24) {
      pcVar12 = tcache->bins + uVar7;
      ppvVar4 = pcVar12->stack_head;
      if (tcache->bins[uVar7].low_bits_full != (uint16_t)ppvVar4) {
        pcVar12->stack_head = ppvVar4 + -1;
        ppvVar4[-1] = ptr;
        return pvVar9;
      }
      if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
        duckdb_je_tcache_bin_flush_small
                  (&tsdn->tsd,tcache,pcVar12,uVar7,
                   (uint)(tcache->bins[uVar7].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01f87c3e:
        ppvVar4 = pcVar12->stack_head;
        if (pcVar12->low_bits_full != (uint16_t)ppvVar4) {
          pcVar12->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
          return pvVar9;
        }
        return pvVar9;
      }
LAB_01f87ba8:
      duckdb_je_arena_dalloc_small(tsdn,ptr);
      return pvVar9;
    }
    if (uVar7 < tcache->tcache_slow->tcache_nbins) {
      ppvVar4 = tcache->bins[uVar7].stack_head;
      if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
        pcVar12 = tcache->bins + uVar7;
        if (tcache->bins[uVar7].low_bits_full != (uint16_t)ppvVar4) {
          pcVar12->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
          return pvVar9;
        }
        duckdb_je_tcache_bin_flush_large
                  (&tsdn->tsd,tcache,pcVar12,uVar7,
                   (uint)(tcache->bins[uVar7].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        goto LAB_01f87c3e;
      }
    }
  }
  if (tsdn == (tsdn_t *)0x0) {
    rtree = (rtree_t *)&newsize;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
  }
  else {
    rtree = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&local_1c8,tsdn,rtree,(rtree_ctx_t *)ptr,(uintptr_t)key);
  duckdb_je_large_dalloc(tsdn,local_1c8.edata);
  return pvVar9;
}

Assistant:

void *
arena_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t oldsize,
    size_t size, size_t alignment, bool zero, bool slab, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	size_t usize = alignment == 0 ? sz_s2u(size) : sz_sa2u(size, alignment);
	if (unlikely(usize == 0 || size > SC_LARGE_MAXCLASS)) {
		return NULL;
	}

	if (likely(slab)) {
		assert(sz_can_use_slab(usize));
		/* Try to avoid moving the allocation. */
		UNUSED size_t newsize;
		if (!arena_ralloc_no_move(tsdn, ptr, oldsize, usize, 0, zero,
		    &newsize)) {
			hook_invoke_expand(hook_args->is_realloc
			    ? hook_expand_realloc : hook_expand_rallocx,
			    ptr, oldsize, usize, (uintptr_t)ptr,
			    hook_args->args);
			return ptr;
		}
	}

	if (oldsize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS) {
		return large_ralloc(tsdn, arena, ptr, usize,
		    alignment, zero, tcache, hook_args);
	}

	/*
	 * size and oldsize are different enough that we need to move the
	 * object.  In that case, fall back to allocating new space and copying.
	 */
	void *ret = arena_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero, slab, tcache);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	/*
	 * Junk/zero-filling were already done by
	 * ipalloc()/arena_malloc().
	 */
	size_t copysize = (usize < oldsize) ? usize : oldsize;
	memcpy(ret, ptr, copysize);
	isdalloct(tsdn, ptr, oldsize, tcache, NULL, true);
	return ret;
}